

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libixy-vfio.c
# Opt level: O0

uint8_t * vfio_map_region(int vfio_fd,int region_index)

{
  int *piVar1;
  uint in_ESI;
  int in_EDI;
  char buf [512];
  int err;
  int64_t result;
  int ret;
  vfio_region_info region_info;
  undefined1 local_248 [516];
  int local_44;
  uint8_t *local_40;
  int local_34;
  undefined8 local_30;
  ulong local_28;
  size_t local_20;
  __off_t local_18;
  int local_c;
  uint8_t *local_8;
  
  local_30 = 0x20;
  local_20 = 0;
  local_18 = 0;
  local_28 = (ulong)in_ESI;
  local_c = in_EDI;
  local_34 = ioctl(in_EDI,0x3b6c,&local_30);
  if (local_34 == -1) {
    local_8 = (uint8_t *)0xffffffffffffffff;
  }
  else {
    local_40 = (uint8_t *)mmap((void *)0x0,local_20,3,1,local_c,local_18);
    local_8 = local_40;
    if (local_40 == (uint8_t *)0xffffffffffffffff) {
      piVar1 = __errno_location();
      local_44 = *piVar1;
      __xpg_strerror_r(local_44,local_248,0x200);
      fprintf(_stderr,"[ERROR] %s:%d %s(): Failed to %s: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/libixy-vfio.c",
              0x127,"vfio_map_region","mmap vfio bar0 resource",local_248);
      exit(local_44);
    }
  }
  return local_8;
}

Assistant:

uint8_t* vfio_map_region(int vfio_fd, int region_index) {
	struct vfio_region_info region_info = {.argsz = sizeof(region_info)};
	region_info.index = region_index;
	int ret = ioctl(vfio_fd, VFIO_DEVICE_GET_REGION_INFO, &region_info);
	if (ret == -1) {
		// Failed to set iommu type
		return MAP_FAILED; // MAP_FAILED == ((void *) -1)
	}
	return (uint8_t*) check_err(mmap(NULL, region_info.size, PROT_READ | PROT_WRITE, MAP_SHARED, vfio_fd, region_info.offset), "mmap vfio bar0 resource");
}